

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

TagBit * __thiscall Qentem::Array<Qentem::Tags::TagBit>::allocate(Array<Qentem::Tags::TagBit> *this)

{
  TagBit *pointer;
  
  pointer = (TagBit *)operator_new((ulong)this->capacity_ << 4);
  MemoryRecord::AddAllocation(pointer);
  this->storage_ = pointer;
  return pointer;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }